

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiles.cc
# Opt level: O1

void __thiscall Tiles::initoptab(Tiles *this)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  anon_struct_20_2_fa2531a9 *paVar4;
  
  paVar4 = this->optab;
  uVar3 = 0;
  do {
    paVar4->n = 0;
    uVar2 = (uint)uVar3;
    if (3 < uVar3) {
      paVar4->n = 1;
      paVar4->ops[0] = uVar2 - 4;
    }
    if ((uVar3 & 3) == 0) {
LAB_0010158d:
      iVar1 = paVar4->n;
      paVar4->n = iVar1 + 1;
      paVar4->ops[iVar1] = uVar2 + 1;
    }
    else {
      iVar1 = paVar4->n;
      paVar4->n = iVar1 + 1;
      paVar4->ops[iVar1] = uVar2 - 1;
      if ((uVar2 & 3) != 3) goto LAB_0010158d;
    }
    if (uVar3 < 0xc) {
      iVar1 = paVar4->n;
      paVar4->n = iVar1 + 1;
      paVar4->ops[iVar1] = uVar2 + 4;
    }
    if (4 < paVar4->n) {
      __assert_fail("optab[i].n <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/shunjilin[P]15PuzzleExternalMemorySearch/src/tiles.cc"
                    ,0x54,"void Tiles::initoptab()");
    }
    uVar3 = uVar3 + 1;
    paVar4 = paVar4 + 1;
    if (uVar3 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void Tiles::initoptab() {
	for (int i = 0; i < Ntiles; i++) {
		optab[i].n = 0;
		if (i >= Width)
			optab[i].ops[optab[i].n++] =  i - Width;
		if (i % Width > 0)
			optab[i].ops[optab[i].n++] =  i - 1;
		if (i % Width < Width - 1)
			optab[i].ops[optab[i].n++] =  i + 1;
		if (i < Ntiles - Width)
			optab[i].ops[optab[i].n++] =  i + Width;
		assert (optab[i].n <= 4);
	}
}